

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  __pid_t _Var1;
  ostream *poVar2;
  AgrgumentException *this;
  streambuf *out_buf;
  string sStack_15c8;
  string local_15a8 [32];
  string local_1588 [32];
  string local_1568;
  string session_name;
  ArgParser args;
  History history;
  
  std::__cxx11::string::string((string *)&history,"hm-db",(allocator *)&session_name);
  ArgParser::ArgParser(&args,(string *)&history);
  std::__cxx11::string::~string((string *)&history);
  ArgParser::parse(&args,argc,argv);
  if ((args.selected & ~select) == help) goto LAB_0012f8f8;
  if (args.selected == add) {
    if ((args.asynchronous == true) && (_Var1 = fork(), _Var1 != 0)) goto LAB_0012fb7e;
  }
  else {
    if (args.selected == configure) {
      std::ofstream::ofstream(&history);
      if (args.conffile._M_string_length == 0) {
        out_buf = *(streambuf **)(*(long *)(std::cerr + -0x18) + 0x207528);
      }
      else {
        std::ofstream::open((string *)&history,(int)&args + 0x428);
        out_buf = (streambuf *)
                  &history.lcSch.super_LastCommandsSchemaColumnsList.sess_id.super_ColumnBase.pos;
      }
      Configurator::Configurator((Configurator *)&session_name,out_buf);
      std::__cxx11::string::string((string *)&local_1568,(string *)&args.hmhome);
      Configurator::configure((Configurator *)&session_name,&local_1568);
      std::__cxx11::string::~string((string *)&local_1568);
LAB_0012f8f8:
      exit(0);
    }
    if (args.selected == wrapped_help) {
      std::__cxx11::string::string((string *)&session_name,"hm",(allocator *)&sStack_15c8);
      WrappedArgsParser::WrappedArgsParser
                ((WrappedArgsParser *)&history,&session_name,&args.select_options);
      std::__cxx11::string::~string((string *)&session_name);
      WrappedArgsParser::print_help((WrappedArgsParser *)&history);
      goto LAB_0012f8f8;
    }
  }
  History::History(&history,&args.db_path);
  switch(args.selected) {
  case new_session:
    if (args.session_name._M_string_length == 0) {
      std::__cxx11::string::string((string *)&session_name,"notdefined",(allocator *)&sStack_15c8);
    }
    else {
      std::__cxx11::string::string((string *)&session_name,(string *)&args.session_name);
    }
    History::insert_sess(&history,&session_name);
    std::ostream::_M_insert<long>((long)&std::cout);
    break;
  case add:
    History::insert_cmd(&history,&args.sess_id,&args.datetime,&args.cwd,&args.cmd,&args.ret_code);
    goto LAB_0012fb71;
  case select:
    std::__cxx11::string::string((string *)&session_name,(string *)&args.selection_session_name);
    if ((args.by_sess == true) && (session_name._M_string_length == 0)) {
      History::get_sess_name(&sStack_15c8,&history,&args.sess_id);
      std::__cxx11::string::operator=((string *)&session_name,(string *)&sStack_15c8);
      std::__cxx11::string::~string((string *)&sStack_15c8);
    }
    History::select(&history,(uint)args.by_dir,(fd_set *)&args.selection_path,
                    (fd_set *)(ulong)args.recursively,(fd_set *)(ulong)(args.by_sess & 1),
                    (timeval *)&session_name);
    if (args.by_sess == true) {
      History::set_sess_name(&history,&args.sess_id,&session_name);
    }
    break;
  case parse:
    History::parse_input_file(&history,&args.filename,&args.separator);
    goto LAB_0012fb71;
  default:
    this = (AgrgumentException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)&session_name,"unsupported mode",(allocator *)&sStack_15c8);
    AgrgumentException::AgrgumentException(this,&session_name);
    __cxa_throw(this,&AgrgumentException::typeinfo,UtilException::~UtilException);
  case info:
    History::get_sess_name(&session_name,&history,&args.sess_id);
    std::__cxx11::string::string(local_1588,(string *)&args.sess_id);
    std::__cxx11::string::string(local_15a8,(string *)&session_name);
    poVar2 = std::operator<<((ostream *)&std::cout,"Session #");
    poVar2 = std::operator<<(poVar2,local_1588);
    poVar2 = std::operator<<(poVar2," with name: ");
    poVar2 = std::operator<<(poVar2,local_15a8);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string(local_15a8);
    std::__cxx11::string::~string(local_1588);
  }
  std::__cxx11::string::~string((string *)&session_name);
LAB_0012fb71:
  History::~History(&history);
LAB_0012fb7e:
  ArgParser::~ArgParser(&args);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
  const ArgParser args("hm-db");

  try {
    args.parse(argc, argv);

    if (args.selected == mode::help || args.selected == mode::version) {
      exit(0);
    }

    if (args.selected == mode::wrapped_help) {
      const WrappedArgsParser wrappedArgs("hm", args.select_options);
      wrappedArgs.print_help();
      exit(0);
    }

    if (args.selected == mode::configure) {
      std::ofstream file;
      std::streambuf* output = std::cerr.rdbuf();

      if (args.conffile.length()) {
        file.open(args.conffile, std::ios_base::app);
        output = file.rdbuf();
      }

      Configurator conf(output);
      conf.configure(args.hmhome);
      exit(0);
    }

    if (args.selected == mode::add && args.asynchronous) {
      if (fork() != 0) {
        return 0;
      }
    }

    History history(args.db_path);

    switch (args.selected) {
      case mode::new_session: {
        std::string session_name =
            args.session_name.length() == 0 ? "notdefined" : args.session_name;
        std::cout << history.insert_sess(session_name);
      } break;
      case mode::add:
        history.insert_cmd(args.sess_id, args.datetime, args.cwd, args.cmd,
                           args.ret_code);
        break;
      case mode::parse:
        history.parse_input_file(args.filename, args.separator);
        break;
      case mode::select: {
        std::string session_name = args.selection_session_name;

        if (args.by_sess && session_name.length() == 0)
          session_name = history.get_sess_name(args.sess_id);

        history.select(args.by_dir, args.selection_path, args.recursively,
                       args.by_sess, session_name);

        if (args.by_sess) history.set_sess_name(args.sess_id, session_name);
      } break;
      case mode::info: {
        std::string session_name = history.get_sess_name(args.sess_id);
        print_session_info(args.sess_id, session_name);
      } break;
      default:
        throw AgrgumentException("unsupported mode");
    }
  } catch (const AgrgumentException& e) {
    std::cout << "Error: " << e.what() << std::endl;
    args.print_usage();
    exit(ARG_ERROR);
  } catch (const UtilException& e) {
    std::cout << "Error: " << e.what() << std::endl;
    exit(FAILED_TO_PROCESS);
  }

  return 0;
}